

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O2

void __thiscall tcu::TestHierarchyIterator::next(TestHierarchyIterator *this)

{
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *this_00;
  TestNodeType TVar1;
  pointer pNVar2;
  TestNode *this_01;
  pointer ppTVar3;
  pointer ppTVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *nodeStack;
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  *nodeStack_00;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *res;
  string nodePath;
  
  this_00 = &this->m_sessionStack;
  do {
    pNVar2 = (this->m_sessionStack).
             super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_sessionStack).
        super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
        ._M_impl.super__Vector_impl_data._M_start == pNVar2) {
      return;
    }
    this_01 = pNVar2[-1].node;
    bVar5 = isTestNodeTypeExecutable(this_01->m_nodeType);
    switch(pNVar2[-1].m_state) {
    case STATE_INIT:
      buildNodePath_abi_cxx11_(&nodePath,(TestHierarchyIterator *)this_00,nodeStack);
      if (bVar5) {
        bVar5 = CaseListFilter::checkTestCaseName(this->m_caseListFilter,nodePath._M_dataplus._M_p);
      }
      else {
        bVar5 = CaseListFilter::checkTestGroupName(this->m_caseListFilter,nodePath._M_dataplus._M_p)
        ;
      }
      if (bVar5 != false) {
        std::__cxx11::string::_M_assign((string *)&this->m_nodePath);
        pNVar2[-1].m_state = STATE_ENTER;
        std::__cxx11::string::~string((string *)&nodePath);
        return;
      }
      std::
      vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
      ::pop_back(this_00);
      std::__cxx11::string::~string((string *)&nodePath);
      break;
    case STATE_ENTER:
      if (bVar5) {
        pNVar2[-1].m_state = STATE_LEAVE;
        return;
      }
      pNVar2[-1].curChildNdx = -1;
      pNVar2[-1].m_state = STATE_TRAVERSE_CHILDREN;
      ppTVar3 = pNVar2[-1].children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pNVar2[-1].children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
        pNVar2[-1].children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppTVar3;
      }
      res = &pNVar2[-1].children;
      TVar1 = this_01->m_nodeType;
      if (TVar1 == NODETYPE_GROUP) {
        (*this->m_inflater->_vptr_TestHierarchyInflater[2])(this->m_inflater,this_01,res);
      }
      else if (TVar1 == NODETYPE_PACKAGE) {
        (**this->m_inflater->_vptr_TestHierarchyInflater)(this->m_inflater,this_01,res);
      }
      else if (TVar1 == NODETYPE_ROOT) {
        TestNode::getChildren(this_01,res);
      }
      break;
    case STATE_TRAVERSE_CHILDREN:
      ppTVar3 = pNVar2[-1].children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppTVar4 = pNVar2[-1].children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      iVar7 = pNVar2[-1].curChildNdx + 1;
      pNVar2[-1].curChildNdx = iVar7;
      if (iVar7 < (int)((ulong)((long)ppTVar4 - (long)ppTVar3) >> 3)) {
        nodePath._M_dataplus._M_p = (pointer)ppTVar3[iVar7];
        nodePath._M_string_length = 0;
        nodePath.field_2._M_allocated_capacity = 0;
        nodePath.field_2._8_8_ = 0;
        std::
        vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
        ::emplace_back<tcu::TestHierarchyIterator::NodeIter>(this_00,(NodeIter *)&nodePath);
        std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
                  ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                   &nodePath._M_string_length);
      }
      else {
        pNVar2[-1].m_state = STATE_LEAVE;
        if (this_01->m_nodeType != NODETYPE_ROOT) {
switchD_0162376d_default:
          return;
        }
      }
      break;
    case STATE_LEAVE:
      if (!bVar5) {
        lVar6 = 8;
        if (this_01->m_nodeType != NODETYPE_PACKAGE) {
          if (this_01->m_nodeType != NODETYPE_GROUP) goto LAB_0162381b;
          lVar6 = 0x18;
        }
        (**(code **)((long)this->m_inflater->_vptr_TestHierarchyInflater + lVar6))
                  (this->m_inflater,this_01);
      }
LAB_0162381b:
      std::
      vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
      ::pop_back(this_00);
      buildNodePath_abi_cxx11_(&nodePath,(TestHierarchyIterator *)this_00,nodeStack_00);
      std::__cxx11::string::operator=((string *)&this->m_nodePath,(string *)&nodePath);
      std::__cxx11::string::~string((string *)&nodePath);
      break;
    default:
      goto switchD_0162376d_default;
    }
  } while( true );
}

Assistant:

void TestHierarchyIterator::next (void)
{
	while (!m_sessionStack.empty())
	{
		NodeIter&			iter		= m_sessionStack.back();
		TestNode* const		node		= iter.node;
		const bool			isLeaf		= isTestNodeTypeExecutable(node->getNodeType());

		switch (iter.getState())
		{
			case NodeIter::STATE_INIT:
			{
				const std::string nodePath = buildNodePath(m_sessionStack);

				// Return to parent if name doesn't match filter.
				if (!(isLeaf ? m_caseListFilter.checkTestCaseName(nodePath.c_str()) : m_caseListFilter.checkTestGroupName(nodePath.c_str())))
				{
					m_sessionStack.pop_back();
					break;
				}

				m_nodePath = nodePath;
				iter.setState(NodeIter::STATE_ENTER);
				return; // Yield enter event
			}

			case NodeIter::STATE_ENTER:
			{
				if (isLeaf)
				{
					iter.setState(NodeIter::STATE_LEAVE);
					return; // Yield leave event
				}
				else
				{
					iter.setState(NodeIter::STATE_TRAVERSE_CHILDREN);
					iter.children.clear();

					switch (node->getNodeType())
					{
						case NODETYPE_ROOT:		static_cast<TestPackageRoot*>(node)->getChildren(iter.children);				break;
						case NODETYPE_PACKAGE:	m_inflater.enterTestPackage(static_cast<TestPackage*>(node), iter.children);	break;
						case NODETYPE_GROUP:	m_inflater.enterGroupNode(static_cast<TestCaseGroup*>(node), iter.children);	break;
						default:
							DE_ASSERT(false);
					}
				}

				break;
			}

			case NodeIter::STATE_TRAVERSE_CHILDREN:
			{
				int numChildren = (int)iter.children.size();
				if (++iter.curChildNdx < numChildren)
				{
					// Push child to stack.
					TestNode* childNode = iter.children[iter.curChildNdx];
					m_sessionStack.push_back(NodeIter(childNode));
				}
				else
				{
					iter.setState(NodeIter::STATE_LEAVE);
					if (node->getNodeType() != NODETYPE_ROOT)
						return; // Yield leave event
				}

				break;
			}

			case NodeIter::STATE_LEAVE:
			{
				// Leave node.
				if (!isLeaf)
				{
					switch (node->getNodeType())
					{
						case NODETYPE_ROOT:		/* root is not de-initialized */								break;
						case NODETYPE_PACKAGE:	m_inflater.leaveTestPackage(static_cast<TestPackage*>(node));	break;
						case NODETYPE_GROUP:	m_inflater.leaveGroupNode(static_cast<TestCaseGroup*>(node));	break;
						default:
							DE_ASSERT(false);
					}
				}

				m_sessionStack.pop_back();
				m_nodePath = buildNodePath(m_sessionStack);
				break;
			}

			default:
				DE_ASSERT(false);
				return;
		}
	}

	DE_ASSERT(m_sessionStack.empty() && getState() == STATE_FINISHED);
}